

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::Decode
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x17 < KVar1) {
    KDataStream::Read<float>(stream,(float *)&this->m_f32ERP);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Freq);
    KDataStream::Read<float>(stream,(float *)&this->m_f32PgRF);
    KDataStream::Read<float>(stream,(float *)&this->m_f32PulseWidth);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32BurstLength);
    KDataStream::Read(stream,&this->m_ui8AppMode);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    KDataStream::Read(stream,&this->m_ui8Padding2);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IFF_ATC_NAVAIDS_FundamentalParameterData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < IFF_ATC_NAVAIDS_FUNDAMENTAL_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f32ERP
           >> m_f32Freq
           >> m_f32PgRF
           >> m_f32PulseWidth
           >> m_ui32BurstLength
           >> m_ui8AppMode
           >> m_ui16Padding1
           >> m_ui8Padding2;
}